

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.cpp
# Opt level: O0

Color * __thiscall
Material::getTextureColor(Color *__return_storage_ptr__,Material *this,double u,double v)

{
  double v_local;
  double u_local;
  Material *this_local;
  
  if (this->m_texture == (Bmp *)0x0) {
    if (this->m_texture_func == (_func_Color_double_double *)0x0) {
      Color::Color(__return_storage_ptr__,1.0,1.0,1.0);
    }
    else {
      (*this->m_texture_func)(__return_storage_ptr__,u,v);
    }
  }
  else {
    Bmp::getColor(__return_storage_ptr__,this->m_texture,u,v);
  }
  return __return_storage_ptr__;
}

Assistant:

Color Material::getTextureColor(double u, double v) const
{
    if (m_texture)
        return m_texture->getColor(u, v);
    else if (m_texture_func)
        return m_texture_func(u, v);
    else
        return Color(1, 1, 1);
}